

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::AddGlobalTarget_Package
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  string *__x;
  char *pcVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  string configFile;
  cmCustomCommandLine singleLine;
  string relConfigFile;
  GlobalTargetInfo gti;
  allocator local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  value_type local_d8;
  undefined1 local_b8 [88];
  pointer pbStack_60;
  pointer local_58;
  pointer pbStack_50;
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  bool local_28;
  
  this_00 = *(this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  iVar2 = (*this->_vptr_cmGlobalGenerator[0xf])();
  pcVar3 = (char *)CONCAT44(extraout_var,iVar2);
  local_b8._0_8_ = local_b8 + 0x10;
  local_b8._8_8_ = 0;
  local_b8[0x10] = '\0';
  local_b8._32_8_ = local_b8 + 0x30;
  local_b8._40_8_ = 0;
  local_b8[0x30] = '\0';
  local_48._M_p = (pointer)&local_38;
  local_b8._64_8_ = (pointer)0x0;
  local_b8._72_8_ = (pointer)0x0;
  local_b8._80_8_ = (pointer)0x0;
  pbStack_60 = (pointer)0x0;
  local_58 = (pointer)0x0;
  pbStack_50 = (pointer)0x0;
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_28 = false;
  (*this->_vptr_cmGlobalGenerator[0x19])(this);
  std::__cxx11::string::assign(local_b8);
  std::__cxx11::string::assign(local_b8 + 0x20);
  local_28 = true;
  cmMakefile::GetCurrentBinaryDirectory(this_00);
  std::__cxx11::string::assign((char *)&local_48);
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __x = cmSystemTools::GetCPackCommand_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_118,__x);
  if (((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) && (*pcVar3 != '.')) {
    std::__cxx11::string::string((string *)&local_138,"-C",(allocator *)&local_d8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
               &local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::string((string *)&local_138,pcVar3,(allocator *)&local_d8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
               &local_138);
    std::__cxx11::string::~string((string *)&local_138);
  }
  std::__cxx11::string::string((string *)&local_138,"--config",(allocator *)&local_d8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
             &local_138);
  std::__cxx11::string::~string((string *)&local_138);
  pcVar3 = cmMakefile::GetCurrentBinaryDirectory(this_00);
  std::__cxx11::string::string((string *)&local_138,pcVar3,(allocator *)&local_d8);
  std::__cxx11::string::append((char *)&local_138);
  std::__cxx11::string::string((string *)&local_d8,"./CPackConfig.cmake",(allocator *)&local_f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_118,&local_d8);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
            ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)(local_b8 + 0x40),
             (value_type *)&local_118);
  iVar2 = (*this->_vptr_cmGlobalGenerator[0x17])(this);
  if (CONCAT44(extraout_var_00,iVar2) == 0) {
    std::__cxx11::string::string((string *)&local_f8,"CMAKE_SKIP_PACKAGE_ALL_DEPENDENCY",&local_139)
    ;
    pcVar3 = cmMakefile::GetDefinition(this_00,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    if (pcVar3 != (char *)0x0) {
      bVar1 = cmSystemTools::IsOff(pcVar3);
      if (!bVar1) goto LAB_0038aa9d;
    }
    iVar2 = (*this->_vptr_cmGlobalGenerator[0x13])(this);
    std::__cxx11::string::string
              ((string *)&local_f8,(char *)CONCAT44(extraout_var_02,iVar2),&local_139);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&pbStack_60,
               &local_f8);
  }
  else {
    iVar2 = (*this->_vptr_cmGlobalGenerator[0x17])(this);
    std::__cxx11::string::string
              ((string *)&local_f8,(char *)CONCAT44(extraout_var_01,iVar2),&local_139);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&pbStack_60,
               &local_f8);
  }
  std::__cxx11::string::~string((string *)&local_f8);
LAB_0038aa9d:
  bVar1 = cmsys::SystemTools::FileExists(local_138._M_dataplus._M_p);
  if (bVar1) {
    std::
    vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
    ::push_back(targets,(value_type *)local_b8);
  }
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_138);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118);
  GlobalTargetInfo::~GlobalTargetInfo((GlobalTargetInfo *)local_b8);
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_Package(
  std::vector<GlobalTargetInfo>& targets)
{
  cmMakefile* mf = this->Makefiles[0];
  const char* cmakeCfgIntDir = this->GetCMakeCFGIntDir();
  GlobalTargetInfo gti;
  gti.Name = this->GetPackageTargetName();
  gti.Message = "Run CPack packaging tool...";
  gti.UsesTerminal = true;
  gti.WorkingDir = mf->GetCurrentBinaryDirectory();
  cmCustomCommandLine singleLine;
  singleLine.push_back(cmSystemTools::GetCPackCommand());
  if (cmakeCfgIntDir && *cmakeCfgIntDir && cmakeCfgIntDir[0] != '.') {
    singleLine.push_back("-C");
    singleLine.push_back(cmakeCfgIntDir);
  }
  singleLine.push_back("--config");
  std::string configFile = mf->GetCurrentBinaryDirectory();
  configFile += "/CPackConfig.cmake";
  std::string relConfigFile = "./CPackConfig.cmake";
  singleLine.push_back(relConfigFile);
  gti.CommandLines.push_back(singleLine);
  if (this->GetPreinstallTargetName()) {
    gti.Depends.push_back(this->GetPreinstallTargetName());
  } else {
    const char* noPackageAll =
      mf->GetDefinition("CMAKE_SKIP_PACKAGE_ALL_DEPENDENCY");
    if (!noPackageAll || cmSystemTools::IsOff(noPackageAll)) {
      gti.Depends.push_back(this->GetAllTargetName());
    }
  }
  if (cmSystemTools::FileExists(configFile.c_str())) {
    targets.push_back(gti);
  }
}